

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,texcoord3d *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  long *plVar4;
  undefined8 *puVar5;
  ostream *poVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  char cVar10;
  undefined8 uVar11;
  ulong uVar12;
  vector<double,_std::allocator<double>_> values;
  string msg;
  string __str_1;
  string __str;
  ostringstream ss_e;
  string local_268;
  vector<double,_std::allocator<double>_> local_248;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  ulong *local_208;
  uint local_200;
  undefined4 uStack_1fc;
  ulong local_1f8 [2];
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  long *local_1a8;
  undefined8 local_1a0;
  long local_198;
  undefined8 uStack_190;
  ios_base local_138 [264];
  
  bVar3 = Expect(this,'(');
  if (!bVar3) {
    return false;
  }
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar3 = SepBy1BasicType<double>(this,',',&local_248);
  if ((bVar3) && (bVar3 = Expect(this,')'), bVar3)) {
    if ((long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start == 0x18) {
      value->s = *local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      value->t = local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
      value->r = local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[2];
      bVar3 = true;
      goto LAB_003d8afa;
    }
    local_1c8[0] = local_1b8;
    ::std::__cxx11::string::_M_construct((ulong)local_1c8,'\x01');
    *(undefined1 *)local_1c8[0] = 0x33;
    plVar4 = (long *)::std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x4202d8);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_1d8 = *plVar7;
      lStack_1d0 = plVar4[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8 = *plVar7;
      local_1e8 = (long *)*plVar4;
    }
    local_1e0 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1e8);
    paVar1 = &local_268.field_2;
    puVar8 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_268.field_2._M_allocated_capacity = *puVar8;
      local_268.field_2._8_8_ = plVar4[3];
      local_268._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_268.field_2._M_allocated_capacity = *puVar8;
      local_268._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_268._M_string_length = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    uVar12 = (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    cVar10 = '\x01';
    if (9 < uVar12) {
      uVar9 = uVar12;
      cVar2 = '\x04';
      do {
        cVar10 = cVar2;
        if (uVar9 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_003d8816;
        }
        if (uVar9 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_003d8816;
        }
        if (uVar9 < 10000) goto LAB_003d8816;
        bVar3 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar2 = cVar10 + '\x04';
      } while (bVar3);
      cVar10 = cVar10 + '\x01';
    }
LAB_003d8816:
    local_208 = local_1f8;
    ::std::__cxx11::string::_M_construct((ulong)&local_208,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_208,local_200,uVar12);
    uVar12 = CONCAT44(uStack_1fc,local_200) + local_268._M_string_length;
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      uVar11 = local_268.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < uVar12) {
      uVar9 = 0xf;
      if (local_208 != local_1f8) {
        uVar9 = local_1f8[0];
      }
      if (uVar9 < uVar12) goto LAB_003d887d;
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_208,0,(char *)0x0,(ulong)local_268._M_dataplus._M_p);
    }
    else {
LAB_003d887d:
      puVar5 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_208);
    }
    local_1a8 = &local_198;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_198 = *plVar4;
      uStack_190 = puVar5[3];
    }
    else {
      local_198 = *plVar4;
      local_1a8 = (long *)*puVar5;
    }
    local_1a0 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1a8);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_218 = *plVar7;
      lStack_210 = plVar4[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *plVar7;
      local_228 = (long *)*plVar4;
    }
    local_220 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
               ,0x5f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"ReadBasicType",0xd);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x9ba);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,(char *)local_228,local_220);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    ::std::ios_base::~ios_base(local_138);
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
  }
  bVar3 = false;
LAB_003d8afa:
  if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool AsciiParser::ReadBasicType(value::texcoord3d *value) {
  if (!Expect('(')) {
    return false;
  }

  std::vector<double> values;
  if (!SepBy1BasicType<double>(',', &values)) {
    return false;
  }

  if (!Expect(')')) {
    return false;
  }

  if (values.size() != 3) {
    std::string msg = "The number of tuple elements must be " +
                      std::to_string(3) + ", but got " +
                      std::to_string(values.size()) + "\n";
    PUSH_ERROR_AND_RETURN(msg);
  }

  value->s = values[0];
  value->t = values[1];
  value->r = values[2];

  return true;
}